

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall CholeskyFactor::recompute(CholeskyFactor *this)

{
  Basis *this_00;
  pointer pdVar1;
  QpVector *rhs;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  int col;
  pointer pdVar5;
  Runtime *pRVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint new_k_max;
  size_t row;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  orig;
  QpVector buffer_ZtQi;
  Matrix temp;
  QpVector buffer_Qcol;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_178;
  ulong local_158;
  CholeskyFactor *local_150;
  QpVector local_148;
  void *local_110;
  pointer local_108;
  pointer piStack_100;
  pointer local_f8;
  pointer piStack_f0;
  pointer local_e8;
  pointer piStack_e0;
  pointer local_d8;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined8 uStack_c7;
  uint local_b8;
  HighsInt local_b4;
  pointer local_b0;
  pointer piStack_a8;
  pointer local_a0;
  pointer piStack_98;
  pointer local_90;
  pointer piStack_88;
  pointer local_80;
  pointer pdStack_78;
  pointer local_70;
  QpVector local_68;
  
  local_178.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (ulong)((long)(this->basis->non_active_constraint_index).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->basis->non_active_constraint_index).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  this->numberofreduces = 0;
  new_k_max = (uint)uVar10;
  local_68.num_nz = 0;
  local_68.dim = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_110,(long)(int)new_k_max,
             (value_type_conflict1 *)&local_68,(allocator_type *)&local_148);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_fill_assign(&local_178,(long)(int)new_k_max,(value_type *)&local_110);
  if ((pointer)local_110 != (pointer)0x0) {
    operator_delete(local_110);
  }
  resize(this,new_k_max);
  local_80 = (pointer)0x0;
  pdStack_78 = (pointer)0x0;
  local_90 = (pointer)0x0;
  piStack_88 = (pointer)0x0;
  local_a0 = (pointer)0x0;
  piStack_98 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  piStack_a8 = (pointer)0x0;
  local_70 = (pointer)0x0;
  local_108 = (pointer)0x0;
  piStack_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  piStack_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  piStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  uStack_d0 = 0;
  uStack_cf = 0;
  uStack_c8 = 0;
  uStack_c7 = 0;
  local_b4 = 0;
  local_b8 = new_k_max;
  QpVector::QpVector(&local_68,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_148,new_k_max);
  pRVar6 = this->runtime;
  if (0 < (pRVar6->instance).num_var) {
    col = 0;
    do {
      MatrixBase::extractcol(&(pRVar6->instance).Q.mat,col,&local_68);
      Basis::Ztprod(this->basis,&local_68,&local_148,false,-1);
      Matrix::append((Matrix *)&local_110,&local_148);
      col = col + 1;
      pRVar6 = this->runtime;
    } while (col < (pRVar6->instance).num_var);
  }
  if (uStack_c7._7_1_ == false) {
    Matrix::transpose((Matrix *)&local_110);
    uStack_c7._7_1_ = true;
  }
  local_158 = uVar10;
  if (0 < (int)new_k_max) {
    uVar10 = 0;
    do {
      this_00 = this->basis;
      rhs = MatrixBase::extractcol((MatrixBase *)&local_110,(HighsInt)uVar10,&local_68);
      Basis::Ztprod(this_00,rhs,&local_148,false,-1);
      if (0 < (long)local_148.num_nz) {
        pdVar1 = local_178.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar7 = 0;
        do {
          pdVar1[local_148.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7]] =
               local_148.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start
               [local_148.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7]];
          lVar7 = lVar7 + 1;
        } while (local_148.num_nz != lVar7);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (new_k_max & 0x7fffffff));
  }
  if (local_178.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_178.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 1;
    lVar7 = 0;
    uVar9 = 0;
    local_150 = this;
    do {
      lVar8 = 0;
      uVar11 = 0;
      do {
        if (uVar11 == uVar9) {
          if (uVar9 == 0) {
            dVar12 = 0.0;
          }
          else {
            pdVar3 = (double *)
                     ((long)(this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar7);
            dVar12 = 0.0;
            uVar4 = uVar9;
            do {
              dVar12 = dVar12 + *pdVar3 * *pdVar3;
              pdVar3 = pdVar3 + this->current_k_max;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
          }
          dVar12 = local_178.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] - dVar12;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
            this = local_150;
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[((long)this->current_k_max + 1) * uVar9] = dVar12;
        }
        else {
          lVar2 = (long)this->current_k_max;
          pdVar1 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar11 == 0) {
            dVar12 = 0.0;
          }
          else {
            dVar12 = 0.0;
            pdVar5 = pdVar1;
            uVar4 = uVar11;
            do {
              dVar12 = dVar12 + *(double *)((long)pdVar5 + lVar7) *
                                *(double *)((long)pdVar5 + lVar8);
              pdVar5 = pdVar5 + lVar2;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
          }
          pdVar1[lVar2 * uVar11 + uVar9] =
               (local_178.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar11] - dVar12) / pdVar1[(lVar2 + 1) * uVar11];
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar11 != uVar10);
      uVar9 = uVar9 + 1;
      uVar10 = uVar10 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar9 < (ulong)(((long)local_178.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_178.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  this->current_k = (HighsInt)local_158;
  this->uptodate = true;
  if (local_148.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80);
  }
  if (piStack_98 != (pointer)0x0) {
    operator_delete(piStack_98);
  }
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0);
  }
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8);
  }
  if (piStack_f0 != (pointer)0x0) {
    operator_delete(piStack_f0);
  }
  if ((pointer)local_108 != (pointer)0x0) {
    operator_delete(local_108);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_178);
  return;
}

Assistant:

void recompute() {
    std::vector<std::vector<double>> orig;
    HighsInt dim_ns = basis.getinactive().size();
    numberofreduces = 0;

    orig.assign(dim_ns, std::vector<double>(dim_ns, 0.0));
    resize(dim_ns);

    Matrix temp(dim_ns, 0);

    QpVector buffer_Qcol(runtime.instance.num_var);
    QpVector buffer_ZtQi(dim_ns);
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      runtime.instance.Q.mat.extractcol(i, buffer_Qcol);
      basis.Ztprod(buffer_Qcol, buffer_ZtQi);
      temp.append(buffer_ZtQi);
    }
    MatrixBase& temp_t = temp.t();
    for (HighsInt i = 0; i < dim_ns; i++) {
      basis.Ztprod(temp_t.extractcol(i, buffer_Qcol), buffer_ZtQi);
      for (HighsInt j = 0; j < buffer_ZtQi.num_nz; j++) {
        orig[i][buffer_ZtQi.index[j]] = buffer_ZtQi.value[buffer_ZtQi.index[j]];
      }
    }

    for (size_t col = 0; col < orig.size(); col++) {
      for (size_t row = 0; row <= col; row++) {
        double sum = 0;
        if (row == col) {
          for (size_t k = 0; k < row; k++)
            sum += L[k * current_k_max + row] * L[k * current_k_max + row];
          L[row * current_k_max + row] = sqrt(orig[row][row] - sum);
        } else {
          for (size_t k = 0; k < row; k++)
            sum += (L[k * current_k_max + col] * L[k * current_k_max + row]);
          L[row * current_k_max + col] =
              (orig[col][row] - sum) / L[row * current_k_max + row];
        }
      }
    }
    current_k = dim_ns;
    uptodate = true;
  }